

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  int local_2c;
  int iElem;
  int k;
  int j;
  int i;
  Vec_Ptr_t *vPtr;
  Vec_Int_t *vInt;
  Vec_Ptr_t *vMasterBarrierDisjunctsArg_local;
  
  if (vMasterBarrierDisjunctsArg != (Vec_Ptr_t *)0x0) {
    for (k = 0; iVar1 = Vec_PtrSize(vMasterBarrierDisjunctsArg), k < iVar1; k = k + 1) {
      p = (Vec_Ptr_t *)Vec_PtrEntry(vMasterBarrierDisjunctsArg,k);
      if (p == (Vec_Ptr_t *)0x0) {
        __assert_fail("vPtr",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/kliveness.c"
                      ,0x1e8,"void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *)");
      }
      for (iElem = 0; iVar1 = Vec_PtrSize(p), iElem < iVar1; iElem = iElem + 1) {
        p_00 = (Vec_Int_t *)Vec_PtrEntry(p,iElem);
        for (local_2c = 0; iVar1 = Vec_IntSize(p_00), local_2c < iVar1; local_2c = local_2c + 1) {
          uVar2 = Vec_IntEntry(p_00,local_2c);
          printf("%d - ",(ulong)uVar2);
        }
      }
      Vec_PtrFree(p);
    }
    Vec_PtrFree(vMasterBarrierDisjunctsArg);
  }
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctVecPtrVecInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	Vec_Ptr_t *vPtr;
	int i, j, k, iElem;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Ptr_t *, vMasterBarrierDisjunctsArg, vPtr, i)
		{	
			assert(vPtr);
			Vec_PtrForEachEntry( Vec_Int_t *, vPtr, vInt, j )
			{
				//Vec_IntFree(vInt);
				Vec_IntForEachEntry( vInt, iElem, k )
					printf("%d - ", iElem);
				//printf("Chung Chang j = %d\n", j);
			}
			Vec_PtrFree(vPtr);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}